

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::BeginCustomSection(BinaryWriter *this,char *name)

{
  Stream *this_00;
  PrintChars in_R9D;
  string_view s;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  char local_88 [8];
  char desc [100];
  char *name_local;
  BinaryWriter *this_local;
  
  snprintf(local_88,100,"section \"%s\"",name);
  WriteSectionHeader(this,local_88,Custom);
  this_00 = this->stream_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,name);
  s._M_str = "custom section name";
  s._M_len = (size_t)local_98._M_str;
  WriteStr((wabt *)this_00,(Stream *)local_98._M_len,s,(char *)0x1,in_R9D);
  return;
}

Assistant:

void BinaryWriter::BeginCustomSection(const char* name) {
  char desc[100];
  wabt_snprintf(desc, sizeof(desc), "section \"%s\"", name);
  WriteSectionHeader(desc, BinarySection::Custom);
  WriteStr(stream_, name, "custom section name", PrintChars::Yes);
}